

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void __thiscall BaseIndex::Sync(BaseIndex *this)

{
  uint256 *puVar1;
  bool bVar2;
  int iVar3;
  CBlockIndex *index;
  long lVar4;
  long lVar5;
  CBlockIndex *pindex_prev;
  long lVar6;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  Level level;
  char *in_stack_fffffffffffffec0;
  char *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  BlockInfo block_info;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  index = (this->m_best_block_index)._M_b._M_p;
  pindex_prev = index;
  if (((this->m_synced)._M_base._M_i & 1U) == 0) {
    fmt = (char *)0x48431f;
    bVar2 = CThreadInterrupt::operator_cast_to_bool(&this->m_interrupt);
    if (!bVar2) {
      in_stack_fffffffffffffed0 = &this->m_name;
      lVar5 = 0;
      lVar6 = 0;
      do {
        criticalblock12.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
        criticalblock12.super_unique_lock._8_8_ =
             criticalblock12.super_unique_lock._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::recursive_mutex>::lock
                  ((unique_lock<std::recursive_mutex> *)&criticalblock12);
        index = NextSyncBlock(pindex_prev,&this->m_chainstate->m_chain);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&criticalblock12);
        if (index == (CBlockIndex *)0x0) {
          SetBestBlockIndex(this,pindex_prev);
          Commit(this);
          criticalblock12.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
          criticalblock12.super_unique_lock._8_8_ =
               criticalblock12.super_unique_lock._8_8_ & 0xffffffffffffff00;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock12);
          index = NextSyncBlock(pindex_prev,&this->m_chainstate->m_chain);
          if (index == (CBlockIndex *)0x0) {
            LOCK();
            (this->m_synced)._M_base._M_i = true;
            UNLOCK();
            in_stack_fffffffffffffec0 = (char *)0x4846bc;
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock12.super_unique_lock)
            ;
            goto LAB_004842ca;
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&criticalblock12);
        }
        if ((index->pprev != pindex_prev) && (bVar2 = Rewind(this,pindex_prev,index->pprev), !bVar2)
           ) {
          FatalErrorf<char[5],std::__cxx11::string>
                    (this,"%s: Failed to rewind index %s to a previous chain tip",
                     (char (*) [5])0x7fab86,in_stack_fffffffffffffed0);
          goto LAB_004845a3;
        }
        local_58._16_3_ = 0;
        local_58._19_8_ = 0;
        local_58._0_8_ = (pointer)0x0;
        local_58._8_3_ = 0;
        local_58._11_5_ = 0;
        criticalblock12.super_unique_lock._M_device = (mutex_type *)0x0;
        criticalblock12.super_unique_lock._M_owns = false;
        criticalblock12.super_unique_lock._9_7_ = 0;
        kernel::MakeBlockInfo(&block_info,index,(CBlock *)0x0);
        bVar2 = ::node::BlockManager::ReadBlockFromDisk
                          (this->m_chainstate->m_blockman,(CBlock *)&criticalblock12,index);
        if (!bVar2) {
          puVar1 = index->phashBlock;
          if (puVar1 == (uint256 *)0x0) {
LAB_004846c3:
            __assert_fail("phashBlock != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                          ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
          }
          local_e8 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
          uStack_e0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
          local_d8 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
          uStack_d0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
          base_blob<256u>::ToString_abi_cxx11_(&local_c8,&local_e8);
          FatalErrorf<char[5],std::__cxx11::string>
                    (this,"%s: Failed to read block %s from disk",(char (*) [5])0x7fab86,&local_c8);
LAB_00484656:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)local_58);
          goto LAB_004845a3;
        }
        block_info.data = (CBlock *)&criticalblock12;
        iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xc])
                          (this,&block_info);
        if ((char)iVar3 == '\0') {
          puVar1 = index->phashBlock;
          if (puVar1 == (uint256 *)0x0) goto LAB_004846c3;
          local_e8 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
          uStack_e0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
          local_d8 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
          uStack_d0 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
          base_blob<256u>::ToString_abi_cxx11_(&local_c8,&local_e8);
          FatalErrorf<char[5],std::__cxx11::string>
                    (this,"%s: Failed to write block %s to index database",(char (*) [5])0x7fab86,
                     &local_c8);
          goto LAB_00484656;
        }
        lVar4 = std::chrono::_V2::steady_clock::now();
        if (lVar5 + 30000000000 < lVar4) {
          logging_function_01._M_str = "Sync";
          logging_function_01._M_len = 4;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
          ;
          source_file_01._M_len = 0x57;
          LogPrintf_<std::__cxx11::string,int>
                    (logging_function_01,source_file_01,0xce,
                     IPC|COINDB|RAND|REINDEX|SELECTCOINS|WALLETDB|NET,
                     (Level)in_stack_fffffffffffffed0,(char *)&index->nHeight,
                     in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffed0);
          lVar5 = lVar4;
        }
        if (lVar6 + 30000000000 < lVar4) {
          SetBestBlockIndex(this,index);
          Commit(this);
          lVar6 = lVar4;
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)local_58);
        fmt = (char *)0x48455f;
        bVar2 = CThreadInterrupt::operator_cast_to_bool(&this->m_interrupt);
        pindex_prev = index;
      } while (!bVar2);
    }
    logging_function_00._M_str = "Sync";
    logging_function_00._M_len = 4;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp";
    source_file_00._M_len = 0x57;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x97,
               IPC|COINDB|RAND|REINDEX|ADDRMAN|ESTIMATEFEE|RPC|HTTP|MEMPOOL|NET,(int)this + 0x90,fmt
               ,in_stack_fffffffffffffec8);
    SetBestBlockIndex(this,index);
    Commit(this);
  }
  else {
LAB_004842ca:
    level = (int)this + 0x90;
    if (pindex_prev == (CBlockIndex *)0x0) {
      logging_function_02._M_str = "Sync";
      logging_function_02._M_len = 4;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
      ;
      source_file_02._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_02,source_file_02,0xde,
                 IPC|COINDB|RAND|REINDEX|SELECTCOINS|RPC|HTTP|NET,level,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffec8);
    }
    else {
      logging_function._M_str = "Sync";
      logging_function._M_len = 4;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintf_<std::__cxx11::string,int>
                (logging_function,source_file,0xdc,
                 IPC|COINDB|RAND|REINDEX|SELECTCOINS|WALLETDB|ZMQ|HTTP|MEMPOOL|NET,level,
                 (char *)&pindex_prev->nHeight,in_stack_fffffffffffffec8,
                 (int *)in_stack_fffffffffffffed0);
    }
  }
LAB_004845a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::Sync()
{
    const CBlockIndex* pindex = m_best_block_index.load();
    if (!m_synced) {
        std::chrono::steady_clock::time_point last_log_time{0s};
        std::chrono::steady_clock::time_point last_locator_write_time{0s};
        while (true) {
            if (m_interrupt) {
                LogPrintf("%s: m_interrupt set; exiting ThreadSync\n", GetName());

                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. If it fails, the error will be already be
                // logged. The best way to recover is to continue, as index cannot be corrupted by
                // a missed commit to disk for an advanced index state.
                Commit();
                return;
            }

            const CBlockIndex* pindex_next = WITH_LOCK(cs_main, return NextSyncBlock(pindex, m_chainstate->m_chain));
            // If pindex_next is null, it means pindex is the chain tip, so
            // commit data indexed so far.
            if (!pindex_next) {
                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. See rationale above.
                Commit();

                // If pindex is still the chain tip after committing, exit the
                // sync loop. It is important for cs_main to be locked while
                // setting m_synced = true, otherwise a new block could be
                // attached while m_synced is still false, and it would not be
                // indexed.
                LOCK(::cs_main);
                pindex_next = NextSyncBlock(pindex, m_chainstate->m_chain);
                if (!pindex_next) {
                    m_synced = true;
                    break;
                }
            }
            if (pindex_next->pprev != pindex && !Rewind(pindex, pindex_next->pprev)) {
                FatalErrorf("%s: Failed to rewind index %s to a previous chain tip", __func__, GetName());
                return;
            }
            pindex = pindex_next;


            CBlock block;
            interfaces::BlockInfo block_info = kernel::MakeBlockInfo(pindex);
            if (!m_chainstate->m_blockman.ReadBlockFromDisk(block, *pindex)) {
                FatalErrorf("%s: Failed to read block %s from disk",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            } else {
                block_info.data = &block;
            }
            if (!CustomAppend(block_info)) {
                FatalErrorf("%s: Failed to write block %s to index database",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            }

            auto current_time{std::chrono::steady_clock::now()};
            if (last_log_time + SYNC_LOG_INTERVAL < current_time) {
                LogPrintf("Syncing %s with block chain from height %d\n",
                          GetName(), pindex->nHeight);
                last_log_time = current_time;
            }

            if (last_locator_write_time + SYNC_LOCATOR_WRITE_INTERVAL < current_time) {
                SetBestBlockIndex(pindex);
                last_locator_write_time = current_time;
                // No need to handle errors in Commit. See rationale above.
                Commit();
            }
        }
    }

    if (pindex) {
        LogPrintf("%s is enabled at height %d\n", GetName(), pindex->nHeight);
    } else {
        LogPrintf("%s is enabled\n", GetName());
    }
}